

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_beta_decode_int(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)*out_size;
  if (*out_size < 1) {
    uVar2 = uVar3;
  }
  if ((c->field_6).external.type == 0) {
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      *(int *)(out + uVar3 * 4) = -(c->field_6).huffman.ncodes;
    }
  }
  else {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = get_bits_MSB(in,(c->field_6).beta.nbits);
      *(uint *)(out + uVar3 * 4) = uVar1 - (c->field_6).huffman.ncodes;
    }
  }
  return 0;
}

Assistant:

int cram_beta_decode_int(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int i, n;

    if (c->beta.nbits) {
	for (i = 0, n = *out_size; i < n; i++)
	    out_i[i] = get_bits_MSB(in, c->beta.nbits) - c->beta.offset;
    } else {
	for (i = 0, n = *out_size; i < n; i++)
	    out_i[i] = -c->beta.offset;
    }

    return 0;
}